

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWriteTruths(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  word *pTruth_00;
  char *pcVar4;
  bool bVar5;
  int local_5c;
  int i;
  int c;
  int fBinary;
  int fReverse;
  int nBytes;
  word *pTruth;
  FILE *pFile;
  char *pFileName;
  Gia_Obj_t *pObj;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar5 = false;
  bVar1 = false;
  Extra_UtilGetoptReset();
  while (iVar2 = Extra_UtilGetopt(argc,argv,"rbh"), iVar2 != -1) {
    if (iVar2 == 0x62) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if ((iVar2 == 0x68) || (iVar2 != 0x72)) goto LAB_003a13c7;
      bVar5 = (bool)(bVar5 ^ 1);
    }
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"IoCommandWriteTruths(): There is no AIG.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar2 = Gia_ManPiNum(pAbc->pGia);
    if (iVar2 < 0x11) {
      iVar2 = Gia_ManPiNum(pAbc->pGia);
      if (iVar2 < 3) {
        Abc_Print(-1,"IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n");
        pAbc_local._4_4_ = 0;
      }
      else if (argc == globalUtilOptind + 1) {
        pcVar4 = argv[globalUtilOptind];
        __stream = fopen(pcVar4,"wb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pcVar4);
          pAbc_local._4_4_ = 0;
        }
        else {
          iVar2 = Gia_ManPiNum(pAbc->pGia);
          iVar2 = Abc_Truth6WordNum(iVar2);
          local_5c = 0;
          while( true ) {
            iVar3 = Vec_IntSize(pAbc->pGia->vCos);
            bVar5 = false;
            if (local_5c < iVar3) {
              pFileName = (char *)Gia_ManCo(pAbc->pGia,local_5c);
              bVar5 = (Gia_Obj_t *)pFileName != (Gia_Obj_t *)0x0;
            }
            if (!bVar5) break;
            pTruth_00 = Gia_ObjComputeTruthTable(pAbc->pGia,(Gia_Obj_t *)pFileName);
            if (bVar1) {
              fwrite(pTruth_00,(long)(iVar2 << 3),1,__stream);
            }
            else {
              iVar3 = Gia_ManPiNum(pAbc->pGia);
              Extra_PrintHex((FILE *)__stream,(uint *)pTruth_00,iVar3);
              fprintf(__stream,"\n");
            }
            local_5c = local_5c + 1;
          }
          fclose(__stream);
          pAbc_local._4_4_ = 0;
        }
      }
      else {
LAB_003a13c7:
        fprintf((FILE *)pAbc->Err,"usage: &write_truths [-rbh] <file>\n");
        fprintf((FILE *)pAbc->Err,
                "\t         writes truth tables of each PO of GIA manager into a file\n");
        pcVar4 = "no";
        if (bVar5) {
          pcVar4 = "yes";
        }
        fprintf((FILE *)pAbc->Err,
                "\t-r     : toggle reversing bits in the truth table [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        fprintf((FILE *)pAbc->Err,"\t-b     : toggle using binary format [default = %s]\n",pcVar4);
        fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
        fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
        pAbc_local._4_4_ = 1;
      }
    }
    else {
      Abc_Print(-1,"IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n");
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWriteTruths( Abc_Frame_t * pAbc, int argc, char **argv )
{
    Gia_Obj_t * pObj;
    char * pFileName;
    FILE * pFile;
    word * pTruth;
    int nBytes;
    int fReverse = 0;
    int fBinary = 0;
    int c, i;
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "rbh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'r':
                fReverse ^= 1;
                break;
            case 'b':
                fBinary ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManPiNum(pAbc->pGia) > 16 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables up to 16 inputs.\n" );
        return 0;
    }
    if ( Gia_ManPiNum(pAbc->pGia) < 3 )
    {
        Abc_Print( -1, "IoCommandWriteTruths(): Can write truth tables for 3 inputs or more.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // convert to logic
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    nBytes = 8 * Abc_Truth6WordNum( Gia_ManPiNum(pAbc->pGia) );
    Gia_ManForEachCo( pAbc->pGia, pObj, i )
    {
        pTruth = Gia_ObjComputeTruthTable( pAbc->pGia, pObj );
        if ( fBinary )
            fwrite( pTruth, nBytes, 1, pFile );
        else
            Extra_PrintHex( pFile, (unsigned *)pTruth, Gia_ManPiNum(pAbc->pGia) ), fprintf( pFile, "\n" );
    }
    fclose( pFile );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_truths [-rbh] <file>\n" );
    fprintf( pAbc->Err, "\t         writes truth tables of each PO of GIA manager into a file\n" );
    fprintf( pAbc->Err, "\t-r     : toggle reversing bits in the truth table [default = %s]\n", fReverse? "yes":"no" );
    fprintf( pAbc->Err, "\t-b     : toggle using binary format [default = %s]\n", fBinary? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}